

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O1

ACT_NODE_t * node_create_next(ACT_NODE_t *nod,AC_ALPHABET_t alpha)

{
  ac_trie *paVar1;
  int iVar2;
  size_t sVar3;
  ACT_NODE_t *next;
  ACT_NODE_t **ppAVar4;
  
  sVar3 = nod->outgoing_size;
  if (sVar3 != 0) {
    ppAVar4 = &nod->outgoing->next;
    do {
      if (((act_edge *)(ppAVar4 + -1))->alpha == alpha) {
        if (*ppAVar4 != (ACT_NODE_t *)0x0) {
          return (ACT_NODE_t *)0x0;
        }
        break;
      }
      ppAVar4 = ppAVar4 + 2;
      sVar3 = sVar3 - 1;
    } while (sVar3 != 0);
  }
  paVar1 = nod->trie;
  next = (ACT_NODE_t *)mpool_malloc(paVar1->mp,0x58);
  iVar2 = node_assign_id::unique_id + 1;
  next->id = node_assign_id::unique_id;
  node_assign_id::unique_id = iVar2;
  *(undefined8 *)&next->final = 0;
  *(undefined8 *)((long)&next->depth + 4) = 0;
  *(undefined8 *)((long)&next->failure_node + 4) = 0;
  *(undefined8 *)((long)&next->outgoing + 4) = 0;
  *(undefined8 *)((long)&next->outgoing_capacity + 4) = 0;
  *(undefined8 *)((long)&next->outgoing_size + 4) = 0;
  *(undefined8 *)((long)&next->matched + 4) = 0;
  *(undefined8 *)((long)&next->matched_capacity + 4) = 0;
  next->matched_size = 0;
  next->to_be_replaced = (AC_PATTERN_t *)0x0;
  next->trie = paVar1;
  node_add_edge(nod,next,alpha);
  return next;
}

Assistant:

ACT_NODE_t *node_create_next (ACT_NODE_t *nod, AC_ALPHABET_t alpha)
{
    ACT_NODE_t *next;
    
    if (node_find_next (nod, alpha) != NULL)
        /* The edge already exists */
        return NULL;
    
    next = node_create (nod->trie);
    node_add_edge (nod, next, alpha);
    
    return next;
}